

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall CfgNode::BlockData::~BlockData(BlockData *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Self local_38;
  iterator ed_1;
  iterator it_1;
  _Self local_20;
  iterator ed;
  iterator it;
  BlockData *this_local;
  
  (this->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_001717d8;
  ed = std::
       map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
       ::begin(&this->m_calls);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
       ::end(&this->m_calls);
  while( true ) {
    bVar1 = std::operator!=(&ed,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CfgCall_*>_>::operator->(&ed);
    if (ppVar2->second != (CfgCall *)0x0) {
      (*ppVar2->second->_vptr_CfgCall[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CfgCall_*>_>::operator++(&ed,0);
  }
  ed_1 = std::
         map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
         ::begin(&this->m_signalHandlers);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
       ::end(&this->m_signalHandlers);
  while( true ) {
    bVar1 = std::operator!=(&ed_1,&local_38);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_CfgSignalHandler_*>_>::operator->(&ed_1);
    if (ppVar3->second != (CfgSignalHandler *)0x0) {
      (*ppVar3->second->_vptr_CfgSignalHandler[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_int,_CfgSignalHandler_*>_>::operator++(&ed_1,0);
  }
  std::
  map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
  ::~map(&this->m_signalHandlers);
  std::
  map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
  ::~map(&this->m_calls);
  std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::~list(&this->m_instrs);
  Data::~Data(&this->super_Data);
  return;
}

Assistant:

CfgNode::BlockData::~BlockData() {
	for (std::map<Addr, CfgCall*>::iterator it = m_calls.begin(),
			ed = m_calls.end(); it != ed; it++) {
		delete it->second;
	}

	for (std::map<int, CfgSignalHandler*>::iterator it = m_signalHandlers.begin(),
			ed = m_signalHandlers.end(); it != ed; it++) {
		delete it->second;
	}
}